

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

bool __thiscall
HighsDomain::ConflictSet::resolveLinearLeq
          (ConflictSet *this,HighsCDouble M,double Mlower,double *vals)

{
  pointer *ppLVar1;
  double *pdVar2;
  pointer pHVar3;
  double dVar4;
  int iVar5;
  pointer pLVar6;
  iterator __position;
  HighsDomain *pHVar7;
  HighsMipSolver *pHVar8;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var9;
  pointer pHVar10;
  pointer ppVar11;
  undefined8 uVar12;
  pointer ppVar13;
  bool bVar14;
  uint uVar15;
  pointer pRVar16;
  ulong uVar17;
  size_type __new_size;
  long lVar18;
  long lVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  double dVar23;
  ulong in_XMM2_Qb;
  double dVar24;
  LocalDomChg locdomchg;
  double lb;
  LocalDomChg local_c8;
  ulong local_a8;
  double local_a0;
  undefined8 local_98;
  double local_90;
  double local_88;
  double local_78;
  vector<HighsDomain::ConflictSet::LocalDomChg,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
  *local_70;
  double *local_68;
  long local_60;
  long local_58;
  pointer local_50;
  double local_48;
  ulong uStack_40;
  
  dVar22 = M.lo;
  local_98._0_4_ = M.hi._0_4_;
  local_98._4_4_ = M.hi._4_4_;
  pLVar6 = (this->resolvedDomainChanges).
           super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resolvedDomainChanges).
      super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar6) {
    (this->resolvedDomainChanges).
    super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar6;
  }
  local_48 = -Mlower;
  uStack_40 = in_XMM2_Qb ^ 0x8000000000000000;
  local_a0 = M.hi;
  dVar24 = local_a0 - Mlower;
  dVar24 = (local_48 - (dVar24 - local_a0)) + (local_a0 - (dVar24 - (dVar24 - local_a0))) + dVar22 +
           dVar24;
  bVar14 = true;
  if (dVar24 < 0.0) {
    local_70 = (vector<HighsDomain::ConflictSet::LocalDomChg,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                *)&this->resolvedDomainChanges;
    pRVar16 = (this->resolveBuffer).
              super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_88 = Mlower;
    local_68 = vals;
    if (0 < (int)((ulong)((long)(this->resolveBuffer).
                                super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar16) >> 5)) {
      lVar19 = 0;
      lVar18 = 0;
      do {
        iVar5 = *(int *)((long)&pRVar16->boundPos + lVar19);
        local_c8.pos = iVar5;
        pHVar3 = (this->localdom->domchgstack_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar5;
        local_c8.domchg.boundval = pHVar3->boundval;
        local_c8.domchg.column = pHVar3->column;
        local_c8.domchg.boundtype = pHVar3->boundtype;
        local_90 = *(double *)((long)&pRVar16->delta + lVar19);
        __position._M_current =
             (this->resolvedDomainChanges).
             super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->resolvedDomainChanges).
            super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<HighsDomain::ConflictSet::LocalDomChg,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
          ::_M_realloc_insert<HighsDomain::ConflictSet::LocalDomChg_const&>
                    (local_70,__position,&local_c8);
          Mlower = local_88;
        }
        else {
          ((__position._M_current)->domchg).column = local_c8.domchg.column;
          ((__position._M_current)->domchg).boundtype = local_c8.domchg.boundtype;
          (__position._M_current)->pos = iVar5;
          *(undefined4 *)&(__position._M_current)->field_0x4 = local_c8._4_4_;
          ((__position._M_current)->domchg).boundval = local_c8.domchg.boundval;
          ppLVar1 = &(this->resolvedDomainChanges).
                     super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppLVar1 = *ppLVar1 + 1;
        }
        local_a0 = (double)CONCAT44(local_98._4_4_,(undefined4)local_98) + local_90;
        dVar22 = dVar22 + ((double)CONCAT44(local_98._4_4_,(undefined4)local_98) -
                          (local_a0 - local_90)) + (local_90 - (local_a0 - (local_a0 - local_90)));
        dVar24 = local_a0 - Mlower;
        dVar24 = (local_48 - (dVar24 - local_a0)) + (local_a0 - (dVar24 - (dVar24 - local_a0))) +
                 dVar22 + dVar24;
        if (0.0 <= dVar24) break;
        lVar18 = lVar18 + 1;
        pRVar16 = (this->resolveBuffer).
                  super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar19 = lVar19 + 0x20;
        local_98._0_4_ = SUB84(local_a0,0);
        local_98._4_4_ = (undefined4)((ulong)local_a0 >> 0x20);
      } while (lVar18 < (int)((ulong)((long)(this->resolveBuffer).
                                            super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pRVar16) >> 5));
    }
    if (0.0 <= dVar24) {
      pdVar2 = &((this->localdom->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
      if ((*pdVar2 <= dVar24 && dVar24 != *pdVar2) &&
         (uVar15 = (int)((ulong)((long)(this->resolvedDomainChanges).
                                       super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->resolvedDomainChanges).
                                      super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
                   - 1, -1 < (int)uVar15)) {
        uVar17 = (ulong)uVar15;
        do {
          pRVar16 = (this->resolveBuffer).
                    super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_50 = pRVar16 + uVar17;
          local_60 = uVar17 * 3;
          pLVar6 = (this->resolvedDomainChanges).
                   super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17;
          local_58 = (long)pRVar16[uVar17].valuePos;
          iVar5 = (pLVar6->domchg).column;
          local_90 = (pLVar6->domchg).boundval;
          local_98 = pRVar16[uVar17].baseBound;
          dVar24 = local_a0 - pRVar16[uVar17].delta;
          local_c8._0_8_ = Mlower - dVar24;
          local_c8.domchg.boundval =
               ((Mlower - (dVar24 + (double)local_c8._0_8_)) +
               (-dVar24 - ((double)local_c8._0_8_ - (dVar24 + (double)local_c8._0_8_)))) -
               ((-pRVar16[uVar17].delta - (dVar24 - local_a0)) +
                (local_a0 - (dVar24 - (dVar24 - local_a0))) + dVar22);
          local_a8 = uVar17;
          if ((pLVar6->domchg).boundtype == kLower) {
            HighsCDouble::operator/=((HighsCDouble *)&local_c8,local_68[local_58]);
            local_78 = local_98 + (double)local_c8._0_8_;
            local_78 = (local_98 - (local_78 - (double)local_c8._0_8_)) +
                       ((double)local_c8._0_8_ - (local_78 - (local_78 - (double)local_c8._0_8_))) +
                       local_c8.domchg.boundval + local_78;
            pHVar7 = this->localdom;
            pHVar8 = pHVar7->mipsolver;
            _Var9._M_head_impl =
                 (pHVar8->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            pHVar10 = (pHVar8->model_->integrality_).
                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                      super__Vector_impl_data._M_start;
            dVar24 = ceil(local_78);
            dVar23 = local_78;
            if (pHVar10[iVar5] != kContinuous) {
              dVar23 = dVar24;
            }
            dVar24 = (_Var9._M_head_impl)->feastol;
            uVar20 = SUB84(dVar24,0);
            uVar21 = (undefined4)((ulong)dVar24 >> 0x20);
            if (dVar23 - local_90 < -dVar24) {
              (pLVar6->domchg).boundval = dVar23;
              if (dVar23 - local_98 <= (_Var9._M_head_impl)->epsilon) goto LAB_00299574;
              ppVar11 = (pHVar7->prevboundval_).
                        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar18 = (long)pLVar6->pos;
              if (dVar23 <= ppVar11[lVar18].first) {
                do {
                  ppVar13 = ppVar11 + lVar18;
                  lVar18 = (long)ppVar13->second;
                } while (dVar23 <= ppVar11[lVar18].first);
                pLVar6->pos = ppVar13->second;
              }
              dVar23 = (dVar23 - local_90) * local_68[local_58];
              dVar24 = local_a0 + dVar23;
              dVar23 = (local_a0 - (dVar24 - dVar23)) + (dVar23 - (dVar24 - (dVar24 - dVar23)));
              goto LAB_00299656;
            }
          }
          else {
            HighsCDouble::operator/=((HighsCDouble *)&local_c8,local_68[local_58]);
            local_78 = local_98 + (double)local_c8._0_8_;
            local_78 = (local_98 - (local_78 - (double)local_c8._0_8_)) +
                       ((double)local_c8._0_8_ - (local_78 - (local_78 - (double)local_c8._0_8_))) +
                       local_c8.domchg.boundval + local_78;
            pHVar7 = this->localdom;
            pHVar8 = pHVar7->mipsolver;
            _Var9._M_head_impl =
                 (pHVar8->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            pHVar10 = (pHVar8->model_->integrality_).
                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                      super__Vector_impl_data._M_start;
            dVar24 = floor(local_78);
            dVar23 = local_78;
            if (pHVar10[iVar5] != kContinuous) {
              dVar23 = dVar24;
            }
            dVar24 = (_Var9._M_head_impl)->feastol;
            uVar20 = SUB84(dVar24,0);
            uVar21 = (undefined4)((ulong)dVar24 >> 0x20);
            if (dVar24 < dVar23 - local_90) {
              (pLVar6->domchg).boundval = dVar23;
              if (-(_Var9._M_head_impl)->epsilon <= dVar23 - local_98) {
LAB_00299574:
                pLVar6 = (this->resolvedDomainChanges).
                         super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                __new_size = (long)(((ulong)((long)(this->resolvedDomainChanges).
                                                                                                      
                                                  super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)pLVar6) >> 3) * -0x5555555500000000 + -0x100000000
                                   ) >> 0x20;
                local_c8.domchg.column = pLVar6[__new_size].domchg.column;
                local_c8.domchg.boundtype = pLVar6[__new_size].domchg.boundtype;
                local_c8._0_8_ = *(undefined8 *)(pLVar6 + __new_size);
                local_c8.domchg.boundval = pLVar6[__new_size].domchg.boundval;
                uVar12 = *(undefined8 *)(&(pLVar6->domchg).column + local_60 * 2);
                pLVar6[__new_size].domchg.column = (int)uVar12;
                pLVar6[__new_size].domchg.boundtype = (int)((ulong)uVar12 >> 0x20);
                dVar24 = ((HighsDomainChange *)(&pLVar6->pos + local_60 * 2 + 2))->boundval;
                *(undefined8 *)(pLVar6 + __new_size) = *(undefined8 *)(&pLVar6->pos + local_60 * 2);
                pLVar6[__new_size].domchg.boundval = dVar24;
                *(undefined8 *)(&(pLVar6->domchg).column + local_60 * 2) = local_c8.domchg._8_8_;
                *(undefined8 *)(&pLVar6->pos + local_60 * 2) = local_c8._0_8_;
                ((HighsDomainChange *)(&pLVar6->pos + local_60 * 2 + 2))->boundval =
                     local_c8.domchg.boundval;
                std::
                vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                ::resize((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                          *)local_70,__new_size);
                dVar23 = local_50->delta;
                dVar24 = local_a0 - dVar23;
                dVar23 = (local_a0 - (dVar23 + dVar24)) + (-dVar23 - (dVar24 - (dVar23 + dVar24)));
                dVar4 = ((this->localdom->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
                uVar20 = SUB84(dVar4,0);
                uVar21 = (undefined4)((ulong)dVar4 >> 0x20);
              }
              else {
                ppVar11 = (pHVar7->prevboundval_).
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar18 = (long)pLVar6->pos;
                if (ppVar11[lVar18].first <= dVar23) {
                  do {
                    ppVar13 = ppVar11 + lVar18;
                    lVar18 = (long)ppVar13->second;
                  } while (ppVar11[lVar18].first <= dVar23);
                  pLVar6->pos = ppVar13->second;
                }
                dVar23 = (dVar23 - local_90) * local_68[local_58];
                dVar24 = local_a0 + dVar23;
                dVar23 = (local_a0 - (dVar24 - dVar23)) + (dVar23 - (dVar24 - (dVar24 - dVar23)));
              }
LAB_00299656:
              dVar22 = dVar22 + dVar23;
              dVar23 = dVar24 - local_88;
              local_a0 = dVar24;
              if ((local_48 - (dVar23 - dVar24)) + (dVar24 - (dVar23 - (dVar23 - dVar24))) + dVar22
                  + dVar23 <= (double)CONCAT44(uVar21,uVar20)) break;
            }
          }
          uVar17 = local_a8 - 1;
          Mlower = local_88;
        } while (0 < (long)local_a8);
      }
      bVar14 = true;
    }
    else {
      bVar14 = false;
    }
  }
  return bVar14;
}

Assistant:

bool HighsDomain::ConflictSet::resolveLinearLeq(HighsCDouble M, double Mlower,
                                                const double* vals) {
  resolvedDomainChanges.clear();
  double covered = double(M - Mlower);
  if (covered < 0) {
    for (HighsInt k = 0; k < (HighsInt)resolveBuffer.size(); ++k) {
      ResolveCandidate& reasonDomchg = resolveBuffer[k];
      LocalDomChg locdomchg;
      locdomchg.pos = reasonDomchg.boundPos;
      locdomchg.domchg = localdom.domchgstack_[reasonDomchg.boundPos];
      M += reasonDomchg.delta;
      resolvedDomainChanges.push_back(locdomchg);
      assert(resolvedDomainChanges.back().pos >= 0);
      assert(resolvedDomainChanges.back().pos <
             (HighsInt)localdom.domchgstack_.size());
      covered = double(M - Mlower);
      if (covered >= 0) break;
    }

    if (covered < 0) {
      // printf("local bounds reach only value of %.12g, need at least
      // %.12g\n",
      //        M, Mlower);
      return false;
    }

    if (covered > localdom.feastol()) {
      // there is room for relaxing bounds / dropping unneeded bound changes
      // from the explanation
      // HighsInt numRelaxed = 0;
      // HighsInt numDropped = 0;
      for (HighsInt k = resolvedDomainChanges.size() - 1; k >= 0; --k) {
        ResolveCandidate& reasonDomchg = resolveBuffer[k];
        LocalDomChg& locdomchg = resolvedDomainChanges[k];
        HighsInt i = reasonDomchg.valuePos;
        HighsInt col = locdomchg.domchg.column;
        if (locdomchg.domchg.boundtype == HighsBoundType::kLower) {
          double lb = locdomchg.domchg.boundval;
          double glb = reasonDomchg.baseBound;
          double relaxLb =
              double(((Mlower - (M - reasonDomchg.delta)) / vals[i]) + glb);
          if (localdom.mipsolver->variableType(col) !=
              HighsVarType::kContinuous)
            relaxLb = std::ceil(relaxLb);

          if (relaxLb - lb >= -localdom.feastol()) continue;

          locdomchg.domchg.boundval = relaxLb;

          if (relaxLb - glb <= localdom.mipsolver->mipdata_->epsilon) {
            // domain change can be fully removed from conflict
            HighsInt last = resolvedDomainChanges.size() - 1;
            std::swap(resolvedDomainChanges[last], resolvedDomainChanges[k]);
            resolvedDomainChanges.resize(last);

            M -= reasonDomchg.delta;
            // ++numDropped;
          } else {
            // bound can be relaxed
            while (relaxLb <= localdom.prevboundval_[locdomchg.pos].first)
              locdomchg.pos = localdom.prevboundval_[locdomchg.pos].second;

            M += vals[i] * (relaxLb - lb);
            // ++numRelaxed;
          }

          covered = double(M - Mlower);
          if (covered <= localdom.feastol()) break;
        } else {
          double ub = locdomchg.domchg.boundval;
          double gub = reasonDomchg.baseBound;
          double relaxUb =
              double(((Mlower - (M - reasonDomchg.delta)) / vals[i]) + gub);
          if (localdom.mipsolver->variableType(col) !=
              HighsVarType::kContinuous)
            relaxUb = std::floor(relaxUb);

          if (relaxUb - ub <= localdom.feastol()) continue;

          locdomchg.domchg.boundval = relaxUb;

          if (relaxUb - gub >= -localdom.mipsolver->mipdata_->epsilon) {
            // domain change can be fully removed from conflict
            HighsInt last = resolvedDomainChanges.size() - 1;
            std::swap(resolvedDomainChanges[last], resolvedDomainChanges[k]);
            resolvedDomainChanges.resize(last);

            M -= reasonDomchg.delta;
            // ++numDropped;
          } else {
            // bound can be relaxed
            while (relaxUb >= localdom.prevboundval_[locdomchg.pos].first)
              locdomchg.pos = localdom.prevboundval_[locdomchg.pos].second;

            M += vals[i] * (relaxUb - ub);
            // ++numRelaxed;
          }

          covered = double(M - Mlower);
          if (covered <= localdom.feastol()) break;
        }
      }

      // if (numRelaxed + numDropped)
      //   printf("relaxed %d and dropped %d of %d resolved domain changes\n",
      //          (int)numRelaxed, (int)numDropped,
      //          (int)resolvedDomainChanges.size());

      assert(covered >= -localdom.mipsolver->mipdata_->feastol);
    }
  }
  return true;
}